

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

message_order * __thiscall FIX::DataDictionary::getOrderedFields(DataDictionary *this)

{
  int *piVar1;
  long lVar2;
  int *order;
  int *piVar3;
  int *piVar4;
  message_order local_40;
  
  if ((this->m_orderedFieldsArray).m_groupOrder.m_buffer == (int *)0x0) {
    piVar4 = (this->m_orderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->m_orderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar2 = (long)piVar1 - (long)piVar4 >> 2;
    order = (int *)operator_new__(-(ulong)(lVar2 + 1U >> 0x3e != 0) | lVar2 * 4 + 4U);
    piVar3 = order;
    for (; piVar1 != piVar4; piVar4 = piVar4 + 1) {
      *piVar3 = *piVar4;
      piVar3 = piVar3 + 1;
    }
    *piVar3 = 0;
    message_order::message_order(&local_40,order);
    message_order::operator=(&this->m_orderedFieldsArray,&local_40);
    shared_array<int>::release(&local_40.m_groupOrder);
    operator_delete__(order);
  }
  return &this->m_orderedFieldsArray;
}

Assistant:

message_order const& DataDictionary::getOrderedFields() const
{
  if( m_orderedFieldsArray ) return m_orderedFieldsArray;

  int * tmp = new int[m_orderedFields.size() + 1];
  int * i = tmp;

  OrderedFields::const_iterator iter;
  for( iter = m_orderedFields.begin(); iter != m_orderedFields.end(); *(i++) = *(iter++) ) {}
  *i = 0;

  m_orderedFieldsArray = message_order(tmp);
  delete [] tmp;

  return m_orderedFieldsArray;
}